

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall
QRenderRule::configurePalette(QRenderRule *this,QPalette *p,ColorRole fr,ColorRole br)

{
  bool bVar1;
  BrushStyle BVar2;
  QStyleSheetBackgroundData *pQVar3;
  QColor *pQVar4;
  int in_ECX;
  int in_EDX;
  QPalette *in_RSI;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  ColorRole in_stack_fffffffffffffe9c;
  QRenderRule *in_stack_fffffffffffffea0;
  undefined4 local_a0;
  undefined2 uStack_9c;
  QBrush local_98 [8];
  undefined6 local_90;
  undefined2 uStack_8a;
  undefined6 local_88;
  undefined2 uStack_82;
  QBrush local_80 [8];
  undefined6 local_78;
  undefined2 uStack_72;
  undefined6 local_70;
  undefined2 uStack_6a;
  QBrush local_68 [8];
  undefined6 local_60;
  undefined2 uStack_5a;
  undefined6 local_58;
  undefined2 uStack_52;
  QBrush local_50 [8];
  undefined8 local_48;
  undefined4 local_40;
  undefined2 local_3c;
  undefined6 local_38;
  undefined2 local_32;
  undefined6 uStack_30;
  undefined6 local_28;
  undefined2 local_22;
  undefined6 uStack_20;
  undefined6 local_18;
  undefined2 local_12;
  undefined6 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = ::QSharedDataPointer::operator_cast_to_QStyleSheetBackgroundData_
                     ((QSharedDataPointer<QStyleSheetBackgroundData> *)in_stack_fffffffffffffea0);
  if (pQVar3 != (QStyleSheetBackgroundData *)0x0) {
    QSharedDataPointer<QStyleSheetBackgroundData>::operator->
              ((QSharedDataPointer<QStyleSheetBackgroundData> *)in_stack_fffffffffffffea0);
    BVar2 = QBrush::style((QBrush *)0x425aca);
    if (BVar2 != NoBrush) {
      if (in_ECX != 0x11) {
        QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                  ((QSharedDataPointer<QStyleSheetBackgroundData> *)in_stack_fffffffffffffea0);
        QPalette::setBrush((QPalette *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                           (QBrush *)0x425b27);
      }
      QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                ((QSharedDataPointer<QStyleSheetBackgroundData> *)in_stack_fffffffffffffea0);
      QPalette::setBrush((QPalette *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                         (QBrush *)0x425b61);
      QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                ((QSharedDataPointer<QStyleSheetBackgroundData> *)in_stack_fffffffffffffea0);
      BVar2 = QBrush::style((QBrush *)0x425b7e);
      if (BVar2 == SolidPattern) {
        QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                  ((QSharedDataPointer<QStyleSheetBackgroundData> *)in_stack_fffffffffffffea0);
        pQVar4 = QBrush::color((QBrush *)0x425bb6);
        auVar5 = QColor::lighter((int)pQVar4);
        local_58 = auVar5._8_6_;
        uStack_52 = auVar5._14_2_;
        local_60 = auVar5._0_6_;
        uStack_5a = auVar5._6_2_;
        uStack_10 = local_58;
        local_18 = local_60;
        local_12 = uStack_5a;
        QBrush::QBrush(local_50,(QColor *)&local_18,SolidPattern);
        QPalette::setBrush((QPalette *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                           (QBrush *)0x425c2a);
        QBrush::~QBrush(local_50);
        QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                  ((QSharedDataPointer<QStyleSheetBackgroundData> *)in_stack_fffffffffffffea0);
        pQVar4 = QBrush::color((QBrush *)0x425c57);
        auVar5 = QColor::lighter((int)pQVar4);
        local_70 = auVar5._8_6_;
        uStack_6a = auVar5._14_2_;
        local_78 = auVar5._0_6_;
        uStack_72 = auVar5._6_2_;
        uStack_20 = local_70;
        local_28 = local_78;
        local_22 = uStack_72;
        QBrush::QBrush(local_68,(QColor *)&local_28,SolidPattern);
        QPalette::setBrush((QPalette *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                           (QBrush *)0x425cc9);
        QBrush::~QBrush(local_68);
        QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                  ((QSharedDataPointer<QStyleSheetBackgroundData> *)in_stack_fffffffffffffea0);
        pQVar4 = QBrush::color((QBrush *)0x425cf6);
        auVar5 = QColor::darker((int)pQVar4);
        local_88 = auVar5._8_6_;
        uStack_82 = auVar5._14_2_;
        local_90 = auVar5._0_6_;
        uStack_8a = auVar5._6_2_;
        uStack_30 = local_88;
        local_38 = local_90;
        local_32 = uStack_8a;
        QBrush::QBrush(local_80,(QColor *)&local_38,SolidPattern);
        QPalette::setBrush((QPalette *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                           (QBrush *)0x425d68);
        QBrush::~QBrush(local_80);
        QSharedDataPointer<QStyleSheetBackgroundData>::operator->
                  ((QSharedDataPointer<QStyleSheetBackgroundData> *)in_stack_fffffffffffffea0);
        pQVar4 = QBrush::color((QBrush *)0x425d98);
        auVar5 = QColor::darker((int)pQVar4);
        local_48 = auVar5._0_8_;
        local_a0 = auVar5._8_4_;
        local_40 = local_a0;
        uStack_9c = auVar5._12_2_;
        local_3c = uStack_9c;
        QBrush::QBrush(local_98,(QColor *)&local_48,SolidPattern);
        QPalette::setBrush((QPalette *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                           (QBrush *)0x425e17);
        QBrush::~QBrush(local_98);
      }
    }
  }
  bVar1 = hasPalette(in_stack_fffffffffffffea0);
  if (bVar1) {
    QSharedDataPointer<QStyleSheetPaletteData>::operator->
              ((QSharedDataPointer<QStyleSheetPaletteData> *)in_stack_fffffffffffffea0);
    BVar2 = QBrush::style((QBrush *)0x425e59);
    if (BVar2 != NoBrush) {
      if (in_EDX != 0x11) {
        QSharedDataPointer<QStyleSheetPaletteData>::operator->
                  ((QSharedDataPointer<QStyleSheetPaletteData> *)in_stack_fffffffffffffea0);
        QPalette::setBrush((QPalette *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                           (QBrush *)0x425eaa);
      }
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)in_stack_fffffffffffffea0);
      QPalette::setBrush((QPalette *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                         (QBrush *)0x425edb);
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)in_stack_fffffffffffffea0);
      QPalette::setBrush((QPalette *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                         (QBrush *)0x425f0f);
    }
    QSharedDataPointer<QStyleSheetPaletteData>::operator->
              ((QSharedDataPointer<QStyleSheetPaletteData> *)in_stack_fffffffffffffea0);
    BVar2 = QBrush::style((QBrush *)0x425f2c);
    if (BVar2 != NoBrush) {
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)in_stack_fffffffffffffea0);
      QPalette::setBrush((QPalette *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                         (QBrush *)0x425f65);
    }
    QSharedDataPointer<QStyleSheetPaletteData>::operator->
              ((QSharedDataPointer<QStyleSheetPaletteData> *)in_stack_fffffffffffffea0);
    BVar2 = QBrush::style((QBrush *)0x425f82);
    if (BVar2 != NoBrush) {
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)in_stack_fffffffffffffea0);
      QPalette::setBrush((QPalette *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                         (QBrush *)0x425fbb);
    }
    QSharedDataPointer<QStyleSheetPaletteData>::operator->
              ((QSharedDataPointer<QStyleSheetPaletteData> *)in_stack_fffffffffffffea0);
    BVar2 = QBrush::style((QBrush *)0x425fd8);
    if (BVar2 != NoBrush) {
      QSharedDataPointer<QStyleSheetPaletteData>::operator->
                ((QSharedDataPointer<QStyleSheetPaletteData> *)in_RSI);
      QPalette::setBrush(in_RSI,in_stack_fffffffffffffe9c,(QBrush *)0x426011);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRenderRule::configurePalette(QPalette *p, QPalette::ColorRole fr, QPalette::ColorRole br)
{
    if (bg && bg->brush.style() != Qt::NoBrush) {
        if (br != QPalette::NoRole)
            p->setBrush(br, bg->brush);
        p->setBrush(QPalette::Window, bg->brush);
        if (bg->brush.style() == Qt::SolidPattern) {
            p->setBrush(QPalette::Light, bg->brush.color().lighter(115));
            p->setBrush(QPalette::Midlight, bg->brush.color().lighter(107));
            p->setBrush(QPalette::Dark, bg->brush.color().darker(150));
            p->setBrush(QPalette::Shadow, bg->brush.color().darker(300));
        }
    }

    if (!hasPalette())
        return;

    if (pal->foreground.style() != Qt::NoBrush) {
        if (fr != QPalette::NoRole)
            p->setBrush(fr, pal->foreground);
        p->setBrush(QPalette::WindowText, pal->foreground);
        p->setBrush(QPalette::Text, pal->foreground);
    }
    if (pal->selectionBackground.style() != Qt::NoBrush)
        p->setBrush(QPalette::Highlight, pal->selectionBackground);
    if (pal->selectionForeground.style() != Qt::NoBrush)
        p->setBrush(QPalette::HighlightedText, pal->selectionForeground);
    if (pal->alternateBackground.style() != Qt::NoBrush)
        p->setBrush(QPalette::AlternateBase, pal->alternateBackground);
}